

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmLineF<(moira::Instr)67,(moira::Mode)12,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  Int i;
  long lVar2;
  char cVar3;
  char *pcVar4;
  
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    cVar3 = '.';
    lVar2 = 1;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar3;
      cVar3 = ".short "[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    i.raw._2_2_ = 0;
    i.raw._0_2_ = op;
    StrWriter::operator<<(str,i);
    return;
  }
  cVar3 = 'd';
  lVar2 = 1;
  do {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = cVar3;
    cVar3 = "dc.w "[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    pcVar4 = str->ptr;
    do {
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
      pcVar4 = str->ptr;
    } while (pcVar4 < str->base + iVar1);
  }
  StrWriter::operator<<(str,(UInt16)op);
  cVar3 = ';';
  lVar2 = 1;
  do {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = cVar3;
    cVar3 = "dc.w    $%04x; opcode 1111"[lVar2 + 0xd];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xe);
  return;
}

Assistant:

void
Moira::dasmLineF(StrWriter &str, u32 &addr, u16 op) const
{
    switch (str.style.syntax) {

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << ".short " << Int{op};
            break;

        default:

            str << "dc.w " << str.tab << UInt16{op} << "; opcode 1111";
    }
}